

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall
despot::TagSHRPolicy::TagSHRPolicy(TagSHRPolicy *this,DSPOMDP *model,ParticleLowerBound *bound)

{
  Floor *extraout_RAX;
  double __x;
  BaseTag *local_50;
  ParticleLowerBound *bound_local;
  DSPOMDP *model_local;
  TagSHRPolicy *this_local;
  
  despot::DefaultPolicy::DefaultPolicy(&this->super_DefaultPolicy,model,bound);
  *(undefined ***)this = &PTR__TagSHRPolicy_00158870;
  if (model == (DSPOMDP *)0x0) {
    local_50 = (BaseTag *)0x0;
  }
  else {
    local_50 = (BaseTag *)(model + -0x38);
  }
  this->tag_model_ = local_50;
  __x = (double)despot::Floor::Floor(&this->floor_);
  BaseTag::floor(this->tag_model_,__x);
  Floor::operator=(&this->floor_,extraout_RAX);
  return;
}

Assistant:

TagSHRPolicy(const DSPOMDP* model, ParticleLowerBound* bound) :
		DefaultPolicy(model, bound),
		tag_model_(static_cast<const BaseTag*>(model)) {
		floor_ = tag_model_->floor();
	}